

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int CVmObjFile::sfid_to_path(char *buf,size_t buflen,int32_t sfid)

{
  int in_EDX;
  undefined1 *in_RDI;
  char path [4096];
  char *fname;
  char *in_stack_ffffffffffffefc8;
  undefined4 in_stack_ffffffffffffefd0;
  size_t in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  int local_4;
  
  if ((in_EDX == 1) || (in_EDX == 2)) {
    (*G_host_ifc_X->_vptr_CVmHostIfc[0x12])(G_host_ifc_X,&stack0xffffffffffffefd8,0x1000,5);
    os_build_full_path(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,
                       (char *)CONCAT44(in_EDX,in_stack_ffffffffffffefd0),in_stack_ffffffffffffefc8)
    ;
    local_4 = 1;
  }
  else {
    *in_RDI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjFile::sfid_to_path(VMG_ char *buf, size_t buflen, int32_t sfid)
{
    const char *fname = 0;
    char path[OSFNMAX];
    switch (sfid)
    {
    case SFID_LIB_DEFAULTS:
        /* library defaults file - T3_APP_DATA/settings.txt */
        fname = "settings.txt";
        goto app_data_file;
        
    case SFID_WEBUI_PREFS:
        /* Web UI preferences - T3_APP_DATA/webprefs.txt */
        fname = "webprefs.txt";
        goto app_data_file;
        
    app_data_file:
        /* get the system application data path */
        G_host_ifc->get_special_file_path(
            path, sizeof(path), OS_GSP_T3_APP_DATA);
        
        /* add the filename */
        os_build_full_path(buf, buflen, path, fname);
        
        /* success */
        return TRUE;
        
    default:
        /* invalid ID value */
        buf[0] = '\0';
        return FALSE;
    }
}